

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg
          (nordic_itch_handler *this,itch_order_executed_with_price *m)

{
  bool bVar1;
  trade_sign sign;
  uint64_t size;
  order_book *ob_00;
  pointer ppVar2;
  uint64_t timestamp;
  trade *t_00;
  long in_RSI;
  nordic_itch_handler *in_RDI;
  trade t;
  execution result;
  order_book *ob;
  uint64_t price;
  uint64_t quantity;
  iterator it;
  uint64_t order_id;
  unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
  *in_stack_fffffffffffffed8;
  order_book *this_00;
  execution *e;
  side_type s;
  undefined8 in_stack_ffffffffffffff20;
  trade local_78;
  uint64_t in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffb8;
  order_book *this_01;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_20;
  uint64_t local_18;
  long local_10;
  
  s = (side_type)((ulong)in_stack_ffffffffffffff20 >> 0x18);
  local_10 = in_RSI;
  local_18 = itch_uatoi((char *)(in_RSI + 1),9);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::find(in_stack_fffffffffffffed8,(key_type *)0x14ac48);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::end(in_stack_fffffffffffffed8);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    size = itch_uatoi((char *)(local_10 + 10),9);
    ob_00 = (order_book *)itch_uatoi((char *)(local_10 + 0x1d),10);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>
                         *)0x14accd);
    this_00 = ppVar2->second;
    e = (execution *)&stack0xffffffffffffffa8;
    order_book::execute(this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    this_01 = this_00;
    timestamp = nordic_itch_handler::timestamp(in_RDI);
    order_book::set_timestamp(this_00,timestamp);
    t_00 = (trade *)nordic_itch_handler::timestamp(in_RDI);
    sign = itch_trade_sign(s);
    trade::trade(&local_78,(uint64_t)t_00,(uint64_t)ob_00,size,sign);
    order_book::symbol_abi_cxx11_(this_01);
    nordic_itch_handler::timestamp(in_RDI);
    sweep_event(in_RDI,e);
    make_event((string *)e,size,ob_00,t_00,(event_mask)((ulong)this_00 >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)t_00,(event *)this_00);
    event::~event((event *)0x14ae0b);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_executed_with_price* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        uint64_t quantity = itch_uatoi(m->ExecutedQuantity, sizeof(m->ExecutedQuantity));
        uint64_t price = itch_uatoi(m->TradePrice, sizeof(m->TradePrice));
        auto& ob = it->second;
        auto result = ob.execute(order_id, quantity);
        ob.set_timestamp(timestamp());
        trade t{timestamp(), price, quantity, itch_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp(), &ob, &t, sweep_event(result)));
    }
}